

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

int zlib_freetable(zlib_table **ztab)

{
  zlib_table *ptr;
  zlib_tableentry *ptr_00;
  int in_EAX;
  int extraout_EAX;
  long lVar1;
  long lVar2;
  
  if ((ztab != (zlib_table **)0x0) && (ptr = *ztab, ptr != (zlib_table *)0x0)) {
    lVar2 = 8;
    for (lVar1 = 0; ptr_00 = ptr->table, lVar1 <= ptr->mask; lVar1 = lVar1 + 1) {
      if (*(long *)(&ptr_00->nbits + lVar2) != 0) {
        zlib_freetable((zlib_table **)(&ptr_00->nbits + lVar2));
      }
      lVar2 = lVar2 + 0x10;
    }
    safefree(ptr_00);
    ptr->table = (zlib_tableentry *)0x0;
    safefree(ptr);
    *ztab = (zlib_table *)0x0;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int zlib_freetable(struct zlib_table **ztab)
{
    struct zlib_table *tab;
    int code;

    if (ztab == NULL)
        return -1;

    if (*ztab == NULL)
        return 0;

    tab = *ztab;

    for (code = 0; code <= tab->mask; code++)
        if (tab->table[code].nexttable != NULL)
            zlib_freetable(&tab->table[code].nexttable);

    sfree(tab->table);
    tab->table = NULL;

    sfree(tab);
    *ztab = NULL;

    return (0);
}